

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O2

pair<llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>,_bool> * __thiscall
llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::insert
          (pair<llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>,_bool>
           *__return_storage_ptr__,SmallPtrSetImpl<llbuild::buildsystem::Node_*> *this,Node *Ptr)

{
  pair<const_void_*const_*,_bool> pVar1;
  SmallPtrSetIteratorImpl SVar2;
  
  pVar1 = SmallPtrSetImplBase::insert_imp(&this->super_SmallPtrSetImplBase,Ptr);
  SVar2 = (SmallPtrSetIteratorImpl)makeIterator(this,pVar1.first);
  (__return_storage_ptr__->first).super_SmallPtrSetIteratorImpl = SVar2;
  __return_storage_ptr__->second = pVar1.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(PtrType Ptr) {
    auto p = insert_imp(PtrTraits::getAsVoidPointer(Ptr));
    return std::make_pair(makeIterator(p.first), p.second);
  }